

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

LoopConstraintSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LoopConstraintSyntax,slang::parsing::Token,slang::syntax::ForeachLoopListSyntax&,slang::syntax::ConstraintItemSyntax&>
          (BumpAllocator *this,Token *args,ForeachLoopListSyntax *args_1,
          ConstraintItemSyntax *args_2)

{
  Token foreachKeyword;
  LoopConstraintSyntax *pLVar1;
  ConstraintItemSyntax *in_RCX;
  ForeachLoopListSyntax *in_RDX;
  LoopConstraintSyntax *in_RSI;
  undefined8 in_RDI;
  Info *unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  
  pLVar1 = (LoopConstraintSyntax *)
           allocate((BumpAllocator *)in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8);
  foreachKeyword.info = unaff_retaddr;
  foreachKeyword.kind = (short)in_RDI;
  foreachKeyword._2_1_ = (char)((ulong)in_RDI >> 0x10);
  foreachKeyword.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  foreachKeyword.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::LoopConstraintSyntax::LoopConstraintSyntax(in_RSI,foreachKeyword,in_RDX,in_RCX);
  return pLVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }